

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O0

QString * qt_accStripAmp(QString *text)

{
  qsizetype qVar1;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  qsizetype ampIndex;
  QString newText;
  QString *in_stack_ffffffffffffff88;
  QString *in_stack_ffffffffffffff90;
  QString *pQVar3;
  QString *in_stack_ffffffffffffffa8;
  QLatin1String *local_48;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = in_RDI;
  QString::QString(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  qVar1 = qt_accAmpIndex(in_stack_ffffffffffffffa8);
  if (qVar1 != -1) {
    QString::remove((longlong)&local_20,qVar1);
  }
  QVar2 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)pQVar3,(size_t)in_stack_ffffffffffffff90);
  Qt::Literals::StringLiterals::operator____L1((char *)pQVar3,(size_t)in_stack_ffffffffffffff90);
  local_48 = (QLatin1String *)QVar2.m_size;
  pQVar3 = &local_20;
  QString::replace((QLatin1String *)pQVar3,local_48,(CaseSensitivity)QVar2.m_data);
  QString::QString(pQVar3,in_stack_ffffffffffffff88);
  QString::~QString((QString *)0x7dce01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString qt_accStripAmp(const QString &text)
{
    QString newText(text);
    qsizetype ampIndex = qt_accAmpIndex(newText);
    if (ampIndex != -1)
        newText.remove(ampIndex, 1);

    return newText.replace("&&"_L1, "&"_L1);
}